

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add_offset.c
# Opt level: O0

int setup_container_add_offset_test(void **state_)

{
  long lVar1;
  long lVar2;
  run_container_t *prVar3;
  bitset_container_t *bitset;
  array_container_t *paVar4;
  run_container_t *prVar5;
  long *in_RDI;
  size_t i_2;
  size_t i_1;
  size_t i;
  run_container_t *rc;
  array_container_t *ac;
  bitset_container_t *bc;
  container_add_offset_test_case_t test;
  container_add_offset_test_state_t *state;
  int in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  ushort uVar6;
  uint16_t pos;
  char *in_stack_ffffffffffffff98;
  run_container_t *run;
  unsigned_long in_stack_ffffffffffffffa0;
  run_container_t *local_58;
  byte bStack_1e;
  
  lVar1 = *in_RDI;
  lVar2 = *(long *)(lVar1 + 8);
  prVar3 = *(run_container_t **)(lVar1 + 0x10);
  bStack_1e = (byte)((ulong)*(undefined8 *)(lVar1 + 0x18) >> 0x10);
  uVar6 = (ushort)bStack_1e;
  pos = 0;
  if (bStack_1e == 1) {
    bitset = bitset_container_create();
    _assert_true(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                 (char *)CONCAT26(pos,CONCAT24(uVar6,in_stack_ffffffffffffff90)),
                 in_stack_ffffffffffffff8c);
    for (local_58 = (run_container_t *)0x0; local_58 < prVar3;
        local_58 = (run_container_t *)((long)&local_58->n_runs + 1)) {
      bitset_container_add(bitset,*(uint16_t *)(lVar2 + (long)local_58 * 2));
    }
    *(bitset_container_t **)(lVar1 + 0x20) = bitset;
  }
  else if (uVar6 == 2) {
    paVar4 = array_container_create();
    _assert_true(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                 (char *)CONCAT26(pos,CONCAT24(uVar6,in_stack_ffffffffffffff90)),
                 in_stack_ffffffffffffff8c);
    for (prVar5 = (run_container_t *)0x0; prVar5 < prVar3;
        prVar5 = (run_container_t *)((long)&prVar5->n_runs + 1)) {
      array_container_add((array_container_t *)
                          CONCAT26(pos,CONCAT24(uVar6,in_stack_ffffffffffffff90)),
                          (uint16_t)((uint)in_stack_ffffffffffffff8c >> 0x10));
    }
    *(array_container_t **)(lVar1 + 0x20) = paVar4;
  }
  else if (uVar6 == 3) {
    prVar5 = run_container_create();
    _assert_true(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                 (char *)CONCAT26(pos,CONCAT24(uVar6,in_stack_ffffffffffffff90)),
                 in_stack_ffffffffffffff8c);
    for (run = (run_container_t *)0x0; run < prVar3;
        run = (run_container_t *)((long)&run->n_runs + 1)) {
      run_container_add(run,pos);
    }
    *(run_container_t **)(lVar1 + 0x20) = prVar5;
  }
  else {
    _assert_true(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                 (char *)(ulong)CONCAT14(bStack_1e,in_stack_ffffffffffffff90),
                 in_stack_ffffffffffffff8c);
  }
  return 0;
}

Assistant:

static int setup_container_add_offset_test(void **state_) {
    container_add_offset_test_state_t *state =
        *(container_add_offset_test_state_t **)state_;
    container_add_offset_test_case_t test = state->test_case;
    bitset_container_t *bc;
    array_container_t *ac;
    run_container_t *rc;

    switch (test.type) {
        case BITSET_CONTAINER_TYPE:
            bc = bitset_container_create();
            assert_true(bc != NULL);
            for (size_t i = 0; i < test.n_values; i++) {
                bitset_container_add(bc, test.values[i]);
            }
            state->in = bc;
            break;
        case ARRAY_CONTAINER_TYPE:
            ac = array_container_create();
            assert_true(ac != NULL);
            for (size_t i = 0; i < test.n_values; i++) {
                array_container_add(ac, test.values[i]);
            }
            state->in = ac;
            break;
        case RUN_CONTAINER_TYPE:
            rc = run_container_create();
            assert_true(rc != NULL);
            for (size_t i = 0; i < test.n_values; i++) {
                run_container_add(rc, test.values[i]);
            }
            state->in = rc;
            break;
        default:
            assert_true(false);  // To catch buggy tests.
    }

    return 0;
}